

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_xformOpOrder_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,
          vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *xformOps,uint32_t indent)

{
  ostream *poVar1;
  uint32_t n;
  OpType *extraout_RDX;
  OpType *extraout_RDX_00;
  OpType *op;
  size_t i;
  ulong uVar2;
  long lVar3;
  long lVar4;
  value_type xformOp;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  if (*(long *)(this + 8) != *(long *)this) {
    pprint::Indent_abi_cxx11_((string *)&xformOp,(pprint *)((ulong)xformOps & 0xffffffff),n);
    poVar1 = ::std::operator<<(local_1a8,(string *)&xformOp);
    ::std::operator<<(poVar1,"uniform token[] xformOpOrder = [");
    ::std::__cxx11::string::_M_dispose();
    lVar4 = 0;
    uVar2 = 0;
    while( true ) {
      lVar3 = *(long *)this;
      if ((ulong)((*(long *)(this + 8) - lVar3) / 0x70) <= uVar2) break;
      if (uVar2 != 0) {
        ::std::operator<<(local_1a8,", ");
        lVar3 = *(long *)this;
      }
      XformOp::XformOp(&xformOp,(XformOp *)(lVar3 + lVar4));
      ::std::operator<<(local_1a8,"\"");
      op = extraout_RDX;
      if (xformOp.inverted == true) {
        ::std::operator<<(local_1a8,"!invert!");
        op = extraout_RDX_00;
      }
      to_string_abi_cxx11_(&local_1d8,(tinyusdz *)&xformOp,op);
      ::std::operator<<(local_1a8,(string *)&local_1d8);
      ::std::__cxx11::string::_M_dispose();
      if (xformOp.suffix._M_string_length != 0) {
        poVar1 = ::std::operator<<(local_1a8,":");
        ::std::operator<<(poVar1,(string *)&xformOp.suffix);
      }
      ::std::operator<<(local_1a8,"\"");
      XformOp::~XformOp(&xformOp);
      uVar2 = uVar2 + 1;
      lVar4 = lVar4 + 0x70;
    }
    ::std::operator<<(local_1a8,"]\n");
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string print_xformOpOrder(const std::vector<XformOp> &xformOps,
                               const uint32_t indent) {
  std::stringstream ss;

  if (xformOps.size()) {
    ss << pprint::Indent(indent) << "uniform token[] xformOpOrder = [";
    for (size_t i = 0; i < xformOps.size(); i++) {
      if (i > 0) {
        ss << ", ";
      }

      auto xformOp = xformOps[i];
      ss << "\"";
      if (xformOp.inverted) {
        ss << "!invert!";
      }
      ss << to_string(xformOp.op_type);
      if (!xformOp.suffix.empty()) {
        ss << ":" << xformOp.suffix;
      }
      ss << "\"";
    }
    ss << "]\n";
  }

  return ss.str();
}